

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.hpp
# Opt level: O3

void __thiscall
miyuki::serialize::InputArchive::_load<std::shared_ptr<Bar>>
          (InputArchive *this,
          vector<std::shared_ptr<Bar>,_std::allocator<std::shared_ptr<Bar>_>_> *vec)

{
  pointer *ppiVar1;
  value_t vVar2;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *this_00;
  iterator __position;
  pointer pbVar3;
  pointer pcVar4;
  bool bVar5;
  char cVar6;
  pointer prVar7;
  size_t sVar8;
  const_reference ref;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  ulong uVar9;
  char cVar10;
  pointer psVar11;
  ulong idx;
  string __str;
  long *local_70;
  uint local_68;
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  prVar7 = (this->stack).
           super__Vector_base<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::allocator<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  idx = 0;
  do {
    this_00 = prVar7[-1]._M_data;
    vVar2 = this_00->m_type;
    sVar8 = (size_t)vVar2;
    if (vVar2 != null) {
      if (vVar2 == object) {
        sVar8 = (((this_00->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
      }
      else if (vVar2 == array) {
        sVar8 = (long)(((this_00->m_value).array)->
                      super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(((this_00->m_value).array)->
                      super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 4;
      }
      else {
        sVar8 = 1;
      }
    }
    if (sVar8 <= idx) {
      return;
    }
    ref = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::at(this_00,idx);
    _makeNode(this,ref);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"/","");
    cVar10 = '\x01';
    if (9 < idx) {
      uVar9 = idx;
      cVar6 = '\x04';
      do {
        cVar10 = cVar6;
        if (uVar9 < 100) {
          cVar10 = cVar10 + -2;
          goto LAB_0011638a;
        }
        if (uVar9 < 1000) {
          cVar10 = cVar10 + -1;
          goto LAB_0011638a;
        }
        if (uVar9 < 10000) goto LAB_0011638a;
        bVar5 = 99999 < uVar9;
        uVar9 = uVar9 / 10000;
        cVar6 = cVar10 + '\x04';
      } while (bVar5);
      cVar10 = cVar10 + '\x01';
    }
LAB_0011638a:
    local_70 = local_60;
    std::__cxx11::string::_M_construct((ulong)&local_70,cVar10);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_70,local_68,idx);
    __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__cxx11::string::_M_append((char *)local_50,(ulong)local_70);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,__args);
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    __position._M_current =
         (vec->super__Vector_base<std::shared_ptr<Bar>,_std::allocator<std::shared_ptr<Bar>_>_>).
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (vec->super__Vector_base<std::shared_ptr<Bar>,_std::allocator<std::shared_ptr<Bar>_>_>).
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<std::shared_ptr<Bar>,_std::allocator<std::shared_ptr<Bar>_>_>::_M_realloc_insert<>
                (vec,__position);
      psVar11 = (vec->
                super__Vector_base<std::shared_ptr<Bar>,_std::allocator<std::shared_ptr<Bar>_>_>).
                _M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      ((__position._M_current)->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)0x0;
      ((__position._M_current)->super___shared_ptr<Bar,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      psVar11 = (vec->
                super__Vector_base<std::shared_ptr<Bar>,_std::allocator<std::shared_ptr<Bar>_>_>).
                _M_impl.super__Vector_impl_data._M_finish + 1;
      (vec->super__Vector_base<std::shared_ptr<Bar>,_std::allocator<std::shared_ptr<Bar>_>_>).
      _M_impl.super__Vector_impl_data._M_finish = psVar11;
    }
    _load<Bar>(this,psVar11 + -1);
    pbVar3 = (this->super_ArchiveBase).locator.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    (this->super_ArchiveBase).locator.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar3 + -1;
    pcVar4 = pbVar3[-1]._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar4 != &pbVar3[-1].field_2) {
      operator_delete(pcVar4,pbVar3[-1].field_2._M_allocated_capacity + 1);
    }
    prVar7 = (this->stack).
             super__Vector_base<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::allocator<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    (this->stack).
    super__Vector_base<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>,_std::allocator<std::reference_wrapper<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = prVar7;
    ppiVar1 = &(this->counter).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppiVar1 = *ppiVar1 + -1;
    idx = idx + 1;
  } while( true );
}

Assistant:

void _load(std::vector<T> &vec) {
            for (size_t i = 0; i < _top().size(); i++) {
                _makeNode(_top().at(i));
                locator.emplace_back(std::string("/").append(std::to_string(i)));
                vec.emplace_back();
                _load(vec.back());
                locator.pop_back();
                _popNode();
            }
        }